

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

DdNode * Cudd_SubsetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  DdNode *pDVar1;
  
  memOut = 0;
  do {
    dd->reordered = 0;
    pDVar1 = cuddSubsetHeavyBranch(dd,f,numVars,threshold);
    if (dd->reordered != 1) {
      return pDVar1;
    }
  } while ((memOut & 1) == 0);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_SubsetHeavyBranch(
  DdManager * dd /* manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the subset */)
{
    DdNode *subset;

    memOut = 0;
    do {
        dd->reordered = 0;
        subset = cuddSubsetHeavyBranch(dd, f, numVars, threshold);
    } while ((dd->reordered == 1) && (!memOut));

    return(subset);

}